

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O3

string * __thiscall
soul::Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,pool_ptr<const_soul::Module> *context,
          Type *type)

{
  Module *pMVar1;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_48;
  
  pMVar1 = context->object;
  if (pMVar1 == (Module *)0x0) {
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_Program.cpp:236:34)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_Program.cpp:236:34)>
               ::_M_manager;
    Type::getDescription
              (&local_48,type,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
                *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    pMVar1 = context->object;
  }
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x10);
  *(ProgramImpl **)local_68._M_unused._0_8_ = this;
  *(Module **)((long)local_68._M_unused._0_8_ + 8) = pMVar1;
  local_50 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_Program.cpp:238:37)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_Program.cpp:238:37)>
             ::_M_manager;
  Type::getDescription
            (__return_storage_ptr__,type,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
              *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getTypeDescriptionWithQualificationIfNeeded (pool_ptr<const Module> context, const Type& type) const
    {
        if (context == nullptr)
            type.getDescription ([] (const Structure& s) { return s.getName(); });

        return type.getDescription ([this, context] (const Structure& s) { return getStructNameWithQualificationIfNeeded (context, s); });
    }